

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ricecomp.c
# Opt level: O3

int fits_rdecomp_short(uchar *c,int clen,unsigned_short *array,int nx,int nblock)

{
  byte bVar1;
  byte bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  byte bVar11;
  char cVar12;
  int iVar13;
  unsigned_short uVar14;
  uint uVar15;
  byte *pbVar16;
  char *err_message;
  long lVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  int iVar22;
  int iVar23;
  long lVar24;
  ulong uVar25;
  undefined1 auVar26 [16];
  int iVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  int iVar42;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  int iVar43;
  int iVar45;
  undefined1 auVar44 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar48 [16];
  
  auVar10 = _DAT_001e7340;
  auVar9 = _DAT_001e7330;
  auVar8 = _DAT_001d00e0;
  auVar7 = _DAT_001d00d0;
  auVar6 = _DAT_001d00c0;
  uVar15 = (uint)(ushort)(*(ushort *)c << 8 | *(ushort *)c >> 8);
  uVar20 = (uint)c[2];
  pbVar16 = c + 3;
  iVar13 = 0;
  uVar19 = 8;
  do {
    if (nx <= iVar13) {
      iVar13 = 0;
      if (c + clen <= pbVar16) {
        return 0;
      }
      err_message = "decompression warning: unused bytes at end of compressed buffer";
      goto LAB_001c4a52;
    }
    if ((int)uVar19 < 4) {
      uVar18 = uVar19 - 0xc;
      do {
        uVar19 = uVar18;
        bVar11 = *pbVar16;
        pbVar16 = pbVar16 + 1;
        uVar20 = (uint)bVar11 | uVar20 << 8;
        uVar18 = uVar19 + 8;
      } while (uVar18 < 0xfffffff8);
      uVar19 = uVar19 + 0x10;
    }
    else {
      uVar19 = uVar19 - 4;
    }
    bVar11 = (byte)uVar19;
    uVar21 = uVar20 >> (bVar11 & 0x1f);
    uVar18 = ~(-1 << (bVar11 & 0x1f));
    uVar20 = uVar20 & uVar18;
    iVar23 = nblock + iVar13;
    if (nx <= nblock + iVar13) {
      iVar23 = nx;
    }
    iVar22 = uVar21 - 1;
    if (iVar22 < 0) {
      if (iVar13 < iVar23) {
        lVar24 = (long)iVar13;
        lVar17 = (iVar23 - lVar24) + -1;
        auVar26._8_4_ = (int)lVar17;
        auVar26._0_8_ = lVar17;
        auVar26._12_4_ = (int)((ulong)lVar17 >> 0x20);
        auVar26 = auVar26 ^ auVar8;
        uVar25 = 0;
        do {
          auVar37._8_4_ = (int)uVar25;
          auVar37._0_8_ = uVar25;
          auVar37._12_4_ = (int)(uVar25 >> 0x20);
          auVar29 = (auVar37 | auVar7) ^ auVar8;
          iVar13 = auVar26._0_4_;
          iVar43 = -(uint)(iVar13 < auVar29._0_4_);
          iVar22 = auVar26._4_4_;
          auVar30._4_4_ = -(uint)(iVar22 < auVar29._4_4_);
          iVar42 = auVar26._8_4_;
          iVar45 = -(uint)(iVar42 < auVar29._8_4_);
          iVar27 = auVar26._12_4_;
          auVar30._12_4_ = -(uint)(iVar27 < auVar29._12_4_);
          auVar39._4_4_ = iVar43;
          auVar39._0_4_ = iVar43;
          auVar39._8_4_ = iVar45;
          auVar39._12_4_ = iVar45;
          auVar46 = pshuflw(in_XMM11,auVar39,0xe8);
          auVar32._4_4_ = -(uint)(auVar29._4_4_ == iVar22);
          auVar32._12_4_ = -(uint)(auVar29._12_4_ == iVar27);
          auVar32._0_4_ = auVar32._4_4_;
          auVar32._8_4_ = auVar32._12_4_;
          auVar48 = pshuflw(in_XMM12,auVar32,0xe8);
          auVar30._0_4_ = auVar30._4_4_;
          auVar30._8_4_ = auVar30._12_4_;
          auVar47 = pshuflw(auVar46,auVar30,0xe8);
          auVar29._8_4_ = 0xffffffff;
          auVar29._0_8_ = 0xffffffffffffffff;
          auVar29._12_4_ = 0xffffffff;
          auVar29 = (auVar47 | auVar48 & auVar46) ^ auVar29;
          auVar29 = packssdw(auVar29,auVar29);
          uVar14 = (unsigned_short)uVar15;
          if ((auVar29 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            array[lVar24 + uVar25] = uVar14;
          }
          auVar30 = auVar32 & auVar39 | auVar30;
          auVar29 = packssdw(auVar30,auVar30);
          auVar47._8_4_ = 0xffffffff;
          auVar47._0_8_ = 0xffffffffffffffff;
          auVar47._12_4_ = 0xffffffff;
          auVar29 = packssdw(auVar29 ^ auVar47,auVar29 ^ auVar47);
          if ((auVar29._0_4_ >> 0x10 & 1) != 0) {
            array[lVar24 + uVar25 + 1] = uVar14;
          }
          auVar29 = (auVar37 | auVar6) ^ auVar8;
          iVar43 = -(uint)(iVar13 < auVar29._0_4_);
          auVar44._4_4_ = -(uint)(iVar22 < auVar29._4_4_);
          iVar45 = -(uint)(iVar42 < auVar29._8_4_);
          auVar44._12_4_ = -(uint)(iVar27 < auVar29._12_4_);
          auVar31._4_4_ = iVar43;
          auVar31._0_4_ = iVar43;
          auVar31._8_4_ = iVar45;
          auVar31._12_4_ = iVar45;
          auVar38._4_4_ = -(uint)(auVar29._4_4_ == iVar22);
          auVar38._12_4_ = -(uint)(auVar29._12_4_ == iVar27);
          auVar38._0_4_ = auVar38._4_4_;
          auVar38._8_4_ = auVar38._12_4_;
          auVar44._0_4_ = auVar44._4_4_;
          auVar44._8_4_ = auVar44._12_4_;
          auVar29 = auVar38 & auVar31 | auVar44;
          auVar29 = packssdw(auVar29,auVar29);
          auVar3._8_4_ = 0xffffffff;
          auVar3._0_8_ = 0xffffffffffffffff;
          auVar3._12_4_ = 0xffffffff;
          auVar29 = packssdw(auVar29 ^ auVar3,auVar29 ^ auVar3);
          if ((auVar29 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            array[lVar24 + uVar25 + 2] = uVar14;
          }
          auVar32 = pshufhw(auVar31,auVar31,0x84);
          auVar39 = pshufhw(auVar38,auVar38,0x84);
          auVar30 = pshufhw(auVar32,auVar44,0x84);
          auVar33._8_4_ = 0xffffffff;
          auVar33._0_8_ = 0xffffffffffffffff;
          auVar33._12_4_ = 0xffffffff;
          auVar33 = (auVar30 | auVar39 & auVar32) ^ auVar33;
          auVar32 = packssdw(auVar33,auVar33);
          if ((auVar32 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            array[lVar24 + uVar25 + 3] = uVar14;
          }
          auVar32 = (auVar37 | auVar10) ^ auVar8;
          iVar43 = -(uint)(iVar13 < auVar32._0_4_);
          auVar35._4_4_ = -(uint)(iVar22 < auVar32._4_4_);
          iVar45 = -(uint)(iVar42 < auVar32._8_4_);
          auVar35._12_4_ = -(uint)(iVar27 < auVar32._12_4_);
          auVar40._4_4_ = iVar43;
          auVar40._0_4_ = iVar43;
          auVar40._8_4_ = iVar45;
          auVar40._12_4_ = iVar45;
          auVar29 = pshuflw(auVar29,auVar40,0xe8);
          auVar34._4_4_ = -(uint)(auVar32._4_4_ == iVar22);
          auVar34._12_4_ = -(uint)(auVar32._12_4_ == iVar27);
          auVar34._0_4_ = auVar34._4_4_;
          auVar34._8_4_ = auVar34._12_4_;
          auVar32 = pshuflw(auVar48 & auVar46,auVar34,0xe8);
          in_XMM12 = auVar32 & auVar29;
          auVar35._0_4_ = auVar35._4_4_;
          auVar35._8_4_ = auVar35._12_4_;
          auVar29 = pshuflw(auVar29,auVar35,0xe8);
          auVar46._8_4_ = 0xffffffff;
          auVar46._0_8_ = 0xffffffffffffffff;
          auVar46._12_4_ = 0xffffffff;
          auVar46 = (auVar29 | in_XMM12) ^ auVar46;
          in_XMM11 = packssdw(auVar46,auVar46);
          if ((in_XMM11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            array[lVar24 + uVar25 + 4] = uVar14;
          }
          auVar35 = auVar34 & auVar40 | auVar35;
          auVar29 = packssdw(auVar35,auVar35);
          auVar48._8_4_ = 0xffffffff;
          auVar48._0_8_ = 0xffffffffffffffff;
          auVar48._12_4_ = 0xffffffff;
          auVar29 = packssdw(auVar29 ^ auVar48,auVar29 ^ auVar48);
          if ((auVar29 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
            array[lVar24 + uVar25 + 5] = uVar14;
          }
          auVar29 = (auVar37 | auVar9) ^ auVar8;
          iVar13 = -(uint)(iVar13 < auVar29._0_4_);
          auVar41._4_4_ = -(uint)(iVar22 < auVar29._4_4_);
          iVar42 = -(uint)(iVar42 < auVar29._8_4_);
          auVar41._12_4_ = -(uint)(iVar27 < auVar29._12_4_);
          auVar36._4_4_ = iVar13;
          auVar36._0_4_ = iVar13;
          auVar36._8_4_ = iVar42;
          auVar36._12_4_ = iVar42;
          auVar28._4_4_ = -(uint)(auVar29._4_4_ == iVar22);
          auVar28._12_4_ = -(uint)(auVar29._12_4_ == iVar27);
          auVar28._0_4_ = auVar28._4_4_;
          auVar28._8_4_ = auVar28._12_4_;
          auVar41._0_4_ = auVar41._4_4_;
          auVar41._8_4_ = auVar41._12_4_;
          auVar29 = auVar28 & auVar36 | auVar41;
          auVar29 = packssdw(auVar29,auVar29);
          auVar4._8_4_ = 0xffffffff;
          auVar4._0_8_ = 0xffffffffffffffff;
          auVar4._12_4_ = 0xffffffff;
          auVar29 = packssdw(auVar29 ^ auVar4,auVar29 ^ auVar4);
          if ((auVar29 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            array[lVar24 + uVar25 + 6] = uVar14;
          }
          auVar37 = pshufhw(auVar36,auVar36,0x84);
          auVar29 = pshufhw(auVar28,auVar28,0x84);
          auVar32 = pshufhw(auVar37,auVar41,0x84);
          auVar5._8_4_ = 0xffffffff;
          auVar5._0_8_ = 0xffffffffffffffff;
          auVar5._12_4_ = 0xffffffff;
          auVar29 = packssdw(auVar29 & auVar37,(auVar32 | auVar29 & auVar37) ^ auVar5);
          if ((auVar29 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            array[lVar24 + uVar25 + 7] = uVar14;
          }
          uVar25 = uVar25 + 8;
          iVar13 = iVar23;
        } while (((iVar23 - lVar24) + 7U & 0xfffffffffffffff8) != uVar25);
      }
    }
    else if (iVar22 == 0xe) {
      if (iVar13 < iVar23) {
        lVar24 = (long)iVar13;
        do {
          uVar21 = uVar20 << ((byte)(0x10 - uVar19) & 0x1f);
          iVar13 = 0x10 - uVar19;
          cVar12 = '\b' - bVar11;
          if (uVar19 < 9) {
            do {
              iVar22 = iVar13;
              iVar13 = iVar22 + -8;
              bVar1 = *pbVar16;
              bVar2 = (byte)iVar13 & 0x1f;
              pbVar16 = pbVar16 + 1;
              uVar21 = uVar21 | (uint)bVar1 << bVar2;
            } while (7 < iVar13);
            if (uVar19 != 0) {
              cVar12 = (char)iVar22 + -0x10;
              goto LAB_001c46ad;
            }
            uVar20 = 0 << bVar2;
          }
          else {
LAB_001c46ad:
            bVar1 = *pbVar16;
            pbVar16 = pbVar16 + 1;
            uVar21 = uVar21 | bVar1 >> (-cVar12 & 0x1fU);
            uVar20 = bVar1 & uVar18;
          }
          uVar15 = uVar15 + (-(uVar21 & 1) ^ uVar21 >> 1);
          array[lVar24] = (unsigned_short)uVar15;
          lVar24 = lVar24 + 1;
          iVar13 = iVar23;
        } while (lVar24 != iVar23);
      }
    }
    else if (iVar13 < iVar23) {
      lVar24 = (long)iVar13;
      do {
        while (uVar20 == 0) {
          uVar19 = uVar19 + 8;
          bVar11 = *pbVar16;
          pbVar16 = pbVar16 + 1;
          uVar20 = (uint)bVar11;
        }
        uVar18 = uVar19 - nonzero_count[uVar20];
        uVar19 = uVar19 + ~uVar18;
        uVar20 = uVar20 ^ 1 << (uVar19 & 0x1f);
        uVar19 = uVar19 - iVar22;
        if ((int)uVar19 < 0) {
          do {
            bVar11 = *pbVar16;
            pbVar16 = pbVar16 + 1;
            uVar20 = uVar20 << 8 | (uint)bVar11;
            uVar19 = uVar19 + 8;
          } while (7 < uVar19);
        }
        uVar18 = uVar20 >> ((byte)uVar19 & 0x1f) | uVar18 << ((byte)iVar22 & 0x1f);
        uVar20 = ~(-1 << ((byte)uVar19 & 0x1f)) & uVar20;
        uVar15 = uVar15 + (-(uVar18 & 1) ^ uVar18 >> 1);
        array[lVar24] = (unsigned_short)uVar15;
        lVar24 = lVar24 + 1;
        iVar13 = iVar23;
      } while (lVar24 != iVar23);
    }
  } while (pbVar16 <= c + clen);
  iVar13 = 1;
  err_message = "decompression error: hit end of compressed byte stream";
LAB_001c4a52:
  ffpmsg(err_message);
  return iVar13;
}

Assistant:

int fits_rdecomp_short (unsigned char *c,		/* input buffer			*/
	     int clen,			/* length of input		*/
	     unsigned short array[],  	/* output array			*/
	     int nx,			/* number of output pixels	*/
	     int nblock)		/* coding block size		*/
{
int i, imax;
/* int bsize; */
int k;
int nbits, nzero, fs;
unsigned char *cend, bytevalue;
unsigned int b, diff, lastpix;
int fsmax, fsbits, bbits;
extern const int nonzero_count[];

   /*
     * Original size of each pixel (bsize, bytes) and coding block
     * size (nblock, pixels)
     * Could make bsize a parameter to allow more efficient
     * compression of short & byte images.
     */

/*    bsize = 2; */
    
/*    nblock = 32; now an input parameter */
    /*
     * From bsize derive:
     * FSBITS = # bits required to store FS
     * FSMAX = maximum value for FS
     * BBITS = bits/pixel for direct coding
     */

/*
    switch (bsize) {
    case 1:
	fsbits = 3;
	fsmax = 6;
	break;
    case 2:
	fsbits = 4;
	fsmax = 14;
	break;
    case 4:
	fsbits = 5;
	fsmax = 25;
	break;
    default:
        ffpmsg("rdecomp: bsize must be 1, 2, or 4 bytes");
	return 1;
    }
*/

    /* move out of switch block, to tweak performance */
    fsbits = 4;
    fsmax = 14;

    bbits = 1<<fsbits;

    /*
     * Decode in blocks of nblock pixels
     */

    /* first 2 bytes of input buffer contain the value of the first */
    /* 2 byte integer value, without any encoding */
    
    lastpix = 0;
    bytevalue = c[0];
    lastpix = lastpix | (bytevalue<<8);
    bytevalue = c[1];
    lastpix = lastpix | bytevalue;

    c += 2;  
    cend = c + clen - 2;

    b = *c++;		    /* bit buffer			*/
    nbits = 8;		    /* number of bits remaining in b	*/
    for (i = 0; i<nx; ) {
	/* get the FS value from first fsbits */
	nbits -= fsbits;
	while (nbits < 0) {
	    b = (b<<8) | (*c++);
	    nbits += 8;
	}
	fs = (b >> nbits) - 1;

	b &= (1<<nbits)-1;
	/* loop over the next block */
	imax = i + nblock;
	if (imax > nx) imax = nx;
	if (fs<0) {
	    /* low-entropy case, all zero differences */
	    for ( ; i<imax; i++) array[i] = lastpix;
	} else if (fs==fsmax) {
	    /* high-entropy case, directly coded pixel values */
	    for ( ; i<imax; i++) {
		k = bbits - nbits;
		diff = b<<k;
		for (k -= 8; k >= 0; k -= 8) {
		    b = *c++;
		    diff |= b<<k;
		}
		if (nbits>0) {
		    b = *c++;
		    diff |= b>>(-k);
		    b &= (1<<nbits)-1;
		} else {
		    b = 0;
		}
   
		/*
		 * undo mapping and differencing
		 * Note that some of these operations will overflow the
		 * unsigned int arithmetic -- that's OK, it all works
		 * out to give the right answers in the output file.
		 */
		if ((diff & 1) == 0) {
		    diff = diff>>1;
		} else {
		    diff = ~(diff>>1);
		}
		array[i] = diff+lastpix;
		lastpix = array[i];
	    }
	} else {
	    /* normal case, Rice coding */
	    for ( ; i<imax; i++) {
		/* count number of leading zeros */
		while (b == 0) {
		    nbits += 8;
		    b = *c++;
		}
		nzero = nbits - nonzero_count[b];
		nbits -= nzero+1;
		/* flip the leading one-bit */
		b ^= 1<<nbits;
		/* get the FS trailing bits */
		nbits -= fs;
		while (nbits < 0) {
		    b = (b<<8) | (*c++);
		    nbits += 8;
		}
		diff = (nzero<<fs) | (b>>nbits);
		b &= (1<<nbits)-1;

		/* undo mapping and differencing */
		if ((diff & 1) == 0) {
		    diff = diff>>1;
		} else {
		    diff = ~(diff>>1);
		}
		array[i] = diff+lastpix;
		lastpix = array[i];
	    }
	}
	if (c > cend) {
            ffpmsg("decompression error: hit end of compressed byte stream");
	    return 1;
	}
    }
    if (c < cend) {
        ffpmsg("decompression warning: unused bytes at end of compressed buffer");
    }
    return 0;
}